

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::PipelineBarrier::logSubmit
          (PipelineBarrier *this,TestLog *log,size_t commandIndex)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  MessageBuilder *pMVar2;
  char *pcVar3;
  char *pcVar4;
  Bitfield<32UL> BStack_1f8;
  Bitfield<32UL> local_1e0;
  Bitfield<32UL> local_1c8;
  Bitfield<32UL> local_1b0;
  MessageBuilder local_198;
  
  this_00 = &local_198.m_str;
  local_198.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,":");
  iVar1 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
  std::operator<<((ostream *)this_00,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<((ostream *)this_00," ");
  pcVar3 = "Image pipeline barrier";
  if (this->m_type == TYPE_BUFFER) {
    pcVar3 = "Buffer pipeline barrier";
  }
  pcVar4 = "Global pipeline barrier";
  if (this->m_type != TYPE_GLOBAL) {
    pcVar4 = pcVar3;
  }
  std::operator<<((ostream *)this_00,pcVar4);
  std::operator<<((ostream *)this_00,", srcStages: ");
  ::vk::getPipelineStageFlagsStr(&local_1b0,this->m_srcStages);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,&local_1b0);
  std::operator<<((ostream *)&pMVar2->m_str,", srcAccesses: ");
  ::vk::getAccessFlagsStr(&local_1c8,this->m_srcAccesses);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c8);
  std::operator<<((ostream *)&pMVar2->m_str,", dstStages: ");
  ::vk::getPipelineStageFlagsStr(&local_1e0,this->m_dstStages);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e0);
  std::operator<<((ostream *)&pMVar2->m_str,", dstAccesses: ");
  ::vk::getAccessFlagsStr(&BStack_1f8,this->m_dstAccesses);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&BStack_1f8);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void PipelineBarrier::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName()
		<< " " << (m_type == TYPE_GLOBAL ? "Global pipeline barrier"
					: m_type == TYPE_BUFFER ? "Buffer pipeline barrier"
					: "Image pipeline barrier")
		<< ", srcStages: " << vk::getPipelineStageFlagsStr(m_srcStages) << ", srcAccesses: " << vk::getAccessFlagsStr(m_srcAccesses)
		<< ", dstStages: " << vk::getPipelineStageFlagsStr(m_dstStages) << ", dstAccesses: " << vk::getAccessFlagsStr(m_dstAccesses) << TestLog::EndMessage;
}